

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sliding_puzzle_test.cpp
# Opt level: O3

int main(void)

{
  pointer pvVar1;
  pointer this;
  char cVar2;
  ostream *poVar3;
  long *plVar4;
  ulong uVar5;
  ulong uVar6;
  Ptr env_ptr;
  Ptr start_state;
  Ptr goal_state;
  int num_inad;
  int puzzle_anchor;
  int puzzle_size;
  AnytimePlannerStats<sliding_puzzle::SlidingPuzzleState> anytime_stats;
  double del_mha_eps;
  double mha_eps;
  double del_eps;
  double eps;
  double time_limit;
  
  puzzle_size = 5;
  puzzle_anchor = 0;
  env_ptr.super___shared_ptr<sliding_puzzle::SlidingPuzzle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<sliding_puzzle::SlidingPuzzle,std::allocator<sliding_puzzle::SlidingPuzzle>,int&,int&>
            (&env_ptr.super___shared_ptr<sliding_puzzle::SlidingPuzzle,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(SlidingPuzzle **)&env_ptr,
             (allocator<sliding_puzzle::SlidingPuzzle> *)&anytime_stats,&puzzle_size,&puzzle_anchor)
  ;
  time_limit = 10.0;
  eps = 10.0;
  del_eps = 1.0;
  mha_eps = 10.0;
  del_mha_eps = 1.0;
  num_inad = 4;
  anytime_stats.solution_paths_.
  super__Vector_base<std::vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>,_std::allocator<std::vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<csbpl_planner::AMHAStar<sliding_puzzle::SlidingPuzzle,sliding_puzzle::SlidingPuzzleState,double>,std::allocator<csbpl_planner::AMHAStar<sliding_puzzle::SlidingPuzzle,sliding_puzzle::SlidingPuzzleState,double>>,std::shared_ptr<sliding_puzzle::SlidingPuzzle>&,double&,double&,double&,double&,double&,int&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &anytime_stats.solution_paths_.
              super__Vector_base<std::vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>,_std::allocator<std::vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish,
             (AMHAStar<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double> **
             )&anytime_stats,
             (allocator<csbpl_planner::AMHAStar<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>_>
              *)&start_state,&env_ptr,&time_limit,&eps,&mha_eps,&del_eps,&del_mha_eps,&num_inad);
  this = anytime_stats.solution_paths_.
         super__Vector_base<std::vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>,_std::allocator<std::vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  pvVar1 = anytime_stats.solution_paths_.
           super__Vector_base<std::vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>,_std::allocator<std::vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  sliding_puzzle::SlidingPuzzle::getStartState
            (env_ptr.super___shared_ptr<sliding_puzzle::SlidingPuzzle,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr);
  sliding_puzzle::SlidingPuzzle::getGoalState
            (env_ptr.super___shared_ptr<sliding_puzzle::SlidingPuzzle,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr);
  cVar2 = (*(code *)(((pvVar1->
                      super__Vector_base<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>
                      )._M_impl.super__Vector_impl_data._M_start)->
                    super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>
                    )._M_ptr)(pvVar1,&start_state,&goal_state);
  if (cVar2 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Plannar did not return any solution. Error!",0x2b);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
    std::ostream::put(-0x28);
    std::ostream::flush();
  }
  else {
    (*(code *)(pvVar1->
              super__Vector_base<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>
              )._M_impl.super__Vector_impl_data._M_start[1].
              super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)(&anytime_stats,pvVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"The num solutions found are: ",0x1d);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    if (anytime_stats.solution_paths_.
        super__Vector_base<std::vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>,_std::allocator<std::vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        anytime_stats.solution_paths_.
        super__Vector_base<std::vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>,_std::allocator<std::vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar6 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Path lengths are: ",0x12);
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," with epsilon: ",0xf);
        poVar3 = std::ostream::_M_insert<double>
                           (anytime_stats.solution_eps_.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar6]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," and planning time is: ",0x17);
        poVar3 = std::ostream::_M_insert<double>
                           (anytime_stats.solution_time_.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar6]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," and hash time is: ",0x13);
        poVar3 = std::ostream::_M_insert<double>(sliding_puzzle::hash_time);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," and num expansions is: ",0x18);
        plVar4 = (long *)std::ostream::operator<<
                                   ((ostream *)poVar3,
                                    anytime_stats.num_expansions_.
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start[uVar6]);
        std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
        std::ostream::put((char)plVar4);
        std::ostream::flush();
        uVar6 = uVar6 + 1;
        uVar5 = ((long)anytime_stats.solution_paths_.
                       super__Vector_base<std::vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>,_std::allocator<std::vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)anytime_stats.solution_paths_.
                       super__Vector_base<std::vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>,_std::allocator<std::vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
      } while (uVar6 <= uVar5 && uVar5 - uVar6 != 0);
    }
    if (anytime_stats.num_expansions_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(anytime_stats.num_expansions_.super__Vector_base<int,_std::allocator<int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)anytime_stats.num_expansions_.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)anytime_stats.num_expansions_.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (anytime_stats.cummulative_time_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(anytime_stats.cummulative_time_.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)anytime_stats.cummulative_time_.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)anytime_stats.cummulative_time_.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (anytime_stats.solution_time_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(anytime_stats.solution_time_.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)anytime_stats.solution_time_.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)anytime_stats.solution_time_.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (anytime_stats.solution_eps_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(anytime_stats.solution_eps_.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)anytime_stats.solution_eps_.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)anytime_stats.solution_eps_.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    std::
    vector<std::vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>,_std::allocator<std::vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>_>_>
    ::~vector(&anytime_stats.solution_paths_);
  }
  if (goal_state.super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (goal_state.
               super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (start_state.super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (start_state.
               super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (this != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this);
  }
  if (env_ptr.super___shared_ptr<sliding_puzzle::SlidingPuzzle,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (env_ptr.super___shared_ptr<sliding_puzzle::SlidingPuzzle,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return 0;
}

Assistant:

int main()
{
  typedef csbpl_planner::Dijkstra<sliding_puzzle::SlidingPuzzle,
                                  sliding_puzzle::SlidingPuzzleState,
                                  double> DijkstraType;
  typedef csbpl_planner::AMHAStar<sliding_puzzle::SlidingPuzzle,
                                  sliding_puzzle::SlidingPuzzleState,
                                  double> AMHAStarType;

  int puzzle_size = 5;
  int puzzle_anchor = 0;
  sliding_puzzle::SlidingPuzzle::Ptr env_ptr =
    std::make_shared<sliding_puzzle::SlidingPuzzle>(puzzle_size,
                                                    puzzle_anchor);

  double time_limit = 10;
  double eps = 10;
  double del_eps = 1;
  
  double mha_eps = 10;
  double del_mha_eps = 1;
  
  int num_inad = 4;

  std::shared_ptr<DijkstraType> planner;
  planner = std::make_shared<AMHAStarType>(env_ptr,
                                           time_limit,
                                           eps,
                                           mha_eps,
                                           del_eps,
                                           del_mha_eps,
                                           num_inad);

  sliding_puzzle::SlidingPuzzleState::Ptr start_state = env_ptr->getStartState();
  sliding_puzzle::SlidingPuzzleState::Ptr goal_state = env_ptr->getGoalState();

  
  if (!planner->run(start_state, goal_state))
  {
    std::cout << "Plannar did not return any solution. Error!" << std::endl;
    return 0;
  }

  csbpl_planner::AnytimePlannerStats<sliding_puzzle::SlidingPuzzleState>
    anytime_stats = planner->getAnytimePlannerStats();
  std::cout << "The num solutions found are: "
            << anytime_stats.solution_paths_.size() << std::endl;
  
  for (int i=0; i<anytime_stats.solution_paths_.size(); ++i)
  {
    std::cout << "Path lengths are: " << anytime_stats.solution_paths_[i].size()
              << " with epsilon: " << anytime_stats.solution_eps_[i]
              << " and planning time is: " << anytime_stats.solution_time_[i]
              << " and hash time is: " << sliding_puzzle::hash_time
              << " and num expansions is: " << anytime_stats.num_expansions_[i] << std::endl;
  }

  return 0;
}